

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall
SpikesConsumer_python::SpikesConsumer_python
          (SpikesConsumer_python *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs
          ,int np)

{
  spikePacket *psVar1;
  object_base oStack_108;
  object_base local_100;
  int local_f4;
  HFParsingInfo local_f0;
  HighFreqDataType local_b0;
  
  HighFreqDataType::HighFreqDataType(&local_b0,hf);
  HFParsingInfo::HFParsingInfo(&local_f0,parseargs);
  SpikesConsumer::SpikesConsumer(&this->super_SpikesConsumer,&local_b0,ringbufsize,&local_f0,np);
  HFParsingInfo::~HFParsingInfo(&local_f0);
  HighFreqDataType::~HighFreqDataType(&local_b0);
  (this->super_wrapper<SpikesConsumer>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_SpikesConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__SpikesConsumer_python_0043b2d0;
  psVar1 = (spikePacket *)operator_new(0x28);
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this->data = psVar1;
  local_f4 = 1;
  boost::python::make_tuple<int>((python *)&local_100,&local_f4);
  boost::python::numpy::detail::get_int_dtype<16,false>((detail *)&oStack_108);
  boost::python::numpy::empty((numpy *)&this->spikearray,(tuple *)&local_100,(dtype *)&oStack_108);
  boost::python::api::object_base::~object_base(&oStack_108);
  boost::python::api::object_base::~object_base(&local_100);
  psVar1 = this->data;
  psVar1->ntrodeid = 0;
  psVar1->cluster = 0;
  psVar1->timestamp = 0;
  std::vector<int2d,_std::allocator<int2d>_>::reserve(&psVar1->points,(long)np);
  return;
}

Assistant:

SpikesConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs, int np)
        : SpikesConsumer(hf, ringbufsize, parseargs, np),
          data(new spikePacket),
          spikearray(np::empty(boost::python::make_tuple(1), np::dtype::get_builtin<int16_t>()))
    {
        data->ntrodeid=0;
        data->cluster=0;
        data->timestamp=0;
        data->points.reserve(np);
    }